

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum2.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_preserve_unknown_enum_unittest::MyMessage::_InternalSerialize
          (MyMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  int *piVar2;
  uint32_t uVar3;
  bool bVar4;
  int iVar5;
  const_reference piVar6;
  int *piVar7;
  byte *pbVar8;
  uint8_t *puVar9;
  byte *extraout_RAX;
  ulong in_RCX;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  
  if ((undefined1  [80])((undefined1  [80])this->field_0 & (undefined1  [80])0x1) ==
      (undefined1  [80])0x0) goto LAB_00d16ca2;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  in_RCX = (ulong)(this->field_0)._impl_.e_;
  pbVar8 = target + 1;
  *target = '\b';
  uVar11 = in_RCX;
  if (0x7f < in_RCX) goto LAB_00d16f87;
  while( true ) {
    *pbVar8 = (byte)in_RCX;
    target = pbVar8 + 1;
LAB_00d16ca2:
    pRVar1 = &(this->field_0)._impl_.repeated_e_;
    iVar5 = google::protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,
                       (undefined1  [80])((undefined1  [80])this->field_0 & (undefined1  [80])0x4)
                       == (undefined1  [80])0x0);
    if (0 < iVar5) {
      iVar14 = 0;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        piVar6 = google::protobuf::RepeatedField<int>::Get(pRVar1,iVar14);
        in_RCX = (ulong)*piVar6;
        pbVar8 = target + 1;
        *target = 0x10;
        uVar11 = in_RCX;
        if (0x7f < in_RCX) {
          do {
            *pbVar8 = (byte)uVar11 | 0x80;
            in_RCX = uVar11 >> 7;
            pbVar8 = pbVar8 + 1;
            bVar4 = 0x3fff < uVar11;
            uVar11 = in_RCX;
          } while (bVar4);
        }
        *pbVar8 = (byte)in_RCX;
        target = pbVar8 + 1;
        iVar14 = iVar14 + 1;
      } while (iVar14 != iVar5);
    }
    uVar13 = *(uint *)((long)&this->field_0 + 0x28);
    if (uVar13 == 0) goto LAB_00d16df7;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) break;
    _InternalSerialize();
    pbVar8 = extraout_RAX;
    uVar11 = in_RCX;
LAB_00d16f87:
    do {
      *pbVar8 = (byte)uVar11 | 0x80;
      in_RCX = uVar11 >> 7;
      pbVar8 = pbVar8 + 1;
      bVar4 = 0x3fff < uVar11;
      uVar11 = in_RCX;
    } while (bVar4);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_packed_e_;
  *target = 0x1a;
  pbVar8 = target + 1;
  uVar12 = uVar13;
  if (0x7f < uVar13) {
    do {
      target = pbVar8;
      *target = (byte)uVar12 | 0x80;
      uVar13 = uVar12 >> 7;
      pbVar8 = target + 1;
      bVar4 = 0x3fff < uVar12;
      uVar12 = uVar13;
    } while (bVar4);
  }
  *pbVar8 = (byte)uVar13;
  if ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    piVar7 = (int *)((long)&this->field_0 + 0x20);
  }
  else {
    piVar7 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  target = target + 2;
  iVar5 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,
                     (undefined1  [16])
                     ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  piVar2 = piVar7 + iVar5;
  do {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar10 = (ulong)*piVar7;
    uVar11 = uVar10;
    if (0x7f < uVar10) {
      do {
        *target = (byte)uVar11 | 0x80;
        uVar10 = uVar11 >> 7;
        target = target + 1;
        bVar4 = 0x3fff < uVar11;
        uVar11 = uVar10;
      } while (bVar4);
    }
    piVar7 = piVar7 + 1;
    *target = (byte)uVar10;
    target = target + 1;
  } while (piVar7 < piVar2);
LAB_00d16df7:
  pRVar1 = &(this->field_0)._impl_.repeated_packed_unexpected_e_;
  iVar5 = google::protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0x30) & 4) == 0);
  if (0 < iVar5) {
    iVar14 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar6 = google::protobuf::RepeatedField<int>::Get(pRVar1,iVar14);
      uVar10 = (ulong)*piVar6;
      pbVar8 = target + 1;
      *target = 0x20;
      uVar11 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar8 = (byte)uVar11 | 0x80;
          uVar10 = uVar11 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar4 = 0x3fff < uVar11;
          uVar11 = uVar10;
        } while (bVar4);
      }
      *pbVar8 = (byte)uVar10;
      target = pbVar8 + 1;
      iVar14 = iVar14 + 1;
    } while (iVar14 != iVar5);
  }
  uVar3 = (this->field_0)._impl_._oneof_case_[0];
  if (uVar3 == 5) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar13 = 0;
    if ((this->field_0)._impl_._oneof_case_[0] == 5) {
      uVar13 = *(uint *)((long)&this->field_0 + 0x44);
    }
    *target = 0x28;
    pbVar8 = target + 1;
    uVar10 = (ulong)(int)uVar13;
    uVar11 = uVar10;
    if (0x7f < uVar13) {
      do {
        *pbVar8 = (byte)uVar11 | 0x80;
        uVar10 = uVar11 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar4 = 0x3fff < uVar11;
        uVar11 = uVar10;
      } while (bVar4);
    }
  }
  else {
    if (uVar3 != 6) goto LAB_00d16f0d;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar13 = 0;
    if ((this->field_0)._impl_._oneof_case_[0] == 6) {
      uVar13 = *(uint *)((long)&this->field_0 + 0x44);
    }
    *target = 0x30;
    pbVar8 = target + 1;
    uVar10 = (ulong)(int)uVar13;
    uVar11 = uVar10;
    if (0x7f < uVar13) {
      do {
        *pbVar8 = (byte)uVar11 | 0x80;
        uVar10 = uVar11 >> 7;
        pbVar8 = pbVar8 + 1;
        bVar4 = 0x3fff < uVar11;
        uVar11 = uVar10;
      } while (bVar4);
    }
  }
  *pbVar8 = (byte)uVar10;
  target = pbVar8 + 1;
LAB_00d16f0d:
  uVar11 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar11 & 1) != 0) {
    puVar9 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar11 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar9;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL MyMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const MyMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_preserve_unknown_enum_unittest.MyMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_preserve_unknown_enum_unittest.MyEnum e = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_e(), target);
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_e = 2;
  for (int i = 0, n = this_._internal_repeated_e_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, static_cast<::proto2_preserve_unknown_enum_unittest::MyEnum>(this_._internal_repeated_e().Get(i)),
        target);
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_e = 3 [features = {
  {
    ::size_t byte_size = this_._impl_._repeated_packed_e_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          3, this_._internal_repeated_packed_e(), byte_size, target);
    }
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_unexpected_e = 4;
  for (int i = 0, n = this_._internal_repeated_packed_unexpected_e_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, static_cast<::proto2_preserve_unknown_enum_unittest::MyEnum>(this_._internal_repeated_packed_unexpected_e().Get(i)),
        target);
  }

  switch (this_.o_case()) {
    case kOneofE1: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          5, this_._internal_oneof_e_1(), target);
      break;
    }
    case kOneofE2: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          6, this_._internal_oneof_e_2(), target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_preserve_unknown_enum_unittest.MyMessage)
  return target;
}